

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O1

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> **objToLoad,
               int param_2,bool toAdopt,XSerializeEngine *serEng)

{
  bool bVar1;
  int iVar2;
  MemoryManager *pMVar3;
  RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *this;
  Grammar *valueToAdopt;
  undefined4 extraout_var;
  void *key;
  ulong uVar4;
  XMLSize_t itemNumber;
  XMLSize_t hashModulus;
  XMLSize_t local_40;
  XMLSize_t local_38;
  
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    XSerializeEngine::readSize(serEng,&local_38);
    if (*objToLoad == (RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)0x0) {
      pMVar3 = XSerializeEngine::getMemoryManager(serEng);
      this = (RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)
             XMemory::operator_new(0x38,pMVar3);
      pMVar3 = XSerializeEngine::getMemoryManager(serEng);
      this->fMemoryManager = pMVar3;
      this->fAdoptedElems = toAdopt;
      this->fBucketList = (RefHashTableBucketElem<xercesc_4_0::Grammar> **)0x0;
      this->fHashModulus = local_38;
      this->fInitialModulus = local_38;
      this->fCount = 0;
      RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::initialize(this,local_38);
      *objToLoad = this;
    }
    XSerializeEngine::registerObject(serEng,*objToLoad);
    local_40 = 0;
    XSerializeEngine::readSize(serEng,&local_40);
    if (local_40 != 0) {
      uVar4 = 0;
      do {
        valueToAdopt = Grammar::loadGrammar(serEng);
        iVar2 = (*(valueToAdopt->super_XSerializable)._vptr_XSerializable[0x16])(valueToAdopt);
        key = (void *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x30))
                                ((long *)CONCAT44(extraout_var,iVar2));
        RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::put
                  (*objToLoad,key,valueToAdopt);
        uVar4 = uVar4 + 1;
      } while (uVar4 < local_40);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefHashTableOf<Grammar>** objToLoad
                                   , int
                                   , bool                      toAdopt
                                   , XSerializeEngine&         serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        XMLSize_t hashModulus;
        serEng.readSize (hashModulus);

        if (!*objToLoad)
        {
            *objToLoad = new (serEng.getMemoryManager())
                             RefHashTableOf<Grammar>(
                                                     hashModulus
                                                   , toAdopt
                                                   , serEng.getMemoryManager()
                                                   );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t itemNumber = 0;
        serEng.readSize (itemNumber);

        for (XMLSize_t itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            Grammar*  data;
            data = Grammar::loadGrammar(serEng);

            XMLCh* key = (XMLCh*) data->getGrammarDescription()->getGrammarKey();
            (*objToLoad)->put(key, data);
        }
    }
}